

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O3

bool __thiscall crnlib::corpus_tester::test(corpus_tester *this,char *pCmd_line)

{
  error_metrics *peVar1;
  _Base_ptr p_Var2;
  long lVar3;
  uint num_channels;
  dynamic_string *pdVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  _Rb_tree_node_base *p_Var9;
  param_map_const_iterator pVar10;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  _Base_ptr *pp_Var15;
  char *pcVar16;
  char **ppcVar17;
  file_desc *pfVar18;
  undefined8 uVar19;
  long lVar20;
  uint y;
  ulong uVar21;
  vector<crnlib::image_utils::error_metrics> metrics [2];
  find_files file_finder;
  image_u8 img;
  error_metrics em;
  command_line_params cmd_line_params;
  timer t;
  error_metrics em2;
  image_u8 orig_img;
  mipmapped_texture tex1;
  mipmapped_texture orig_tex;
  image_u8 img2;
  image_u8 img1;
  image_u8 hybrid_img;
  image_u8 b;
  image_u8 a;
  image_u8 o;
  mipmapped_texture tex2;
  image_u8 *local_428;
  uint local_420;
  uint local_41c;
  vector<crnlib::image_utils::error_metrics> local_418;
  vector<crnlib::image_utils::error_metrics> local_408;
  double local_3f8;
  double local_3f0;
  find_files local_3e8;
  ulong local_3c8;
  uint local_3bc;
  image_u8 local_3b8;
  _Rb_tree_node_base *local_380;
  double local_378;
  ulong local_370;
  corpus_tester *local_368;
  image_u8 *local_360;
  image_u8 *local_358;
  pack_params local_350;
  error_metrics local_318;
  ulong local_2f0;
  ulong local_2e8;
  command_line_params local_2e0;
  timer local_2a0;
  error_metrics local_288;
  image_u8 local_258;
  undefined1 local_228 [24];
  undefined8 local_210;
  vector<crnlib::mip_level_*> *local_208;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1e0 [8];
  long *local_1c0;
  int local_1b8;
  image_u8 local_198;
  image_u8 local_168;
  image<crnlib::color_quad<unsigned_char,_int>_> local_138;
  image<crnlib::color_quad<unsigned_char,_int>_> local_108;
  image<crnlib::color_quad<unsigned_char,_int>_> local_d8;
  image<crnlib::color_quad<unsigned_char,_int>_> local_a8;
  mipmapped_texture local_78;
  
  local_368 = this;
  console::printf("Command line:\n\"%s\"");
  command_line_params::command_line_params(&local_2e0);
  bVar5 = command_line_params::parse(&local_2e0,pCmd_line,10,test::param_desc_array,true);
  if (bVar5) {
    if ((_Rb_tree_header *)
        local_2e0.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
        &local_2e0.m_param_map._M_t._M_impl.super__Rb_tree_header) {
      local_3f8 = 0.0;
      local_3f0 = 0.0;
    }
    else {
      local_3f0 = 0.0;
      local_3f8 = 0.0;
      p_Var9 = local_2e0.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        iVar7 = dynamic_string::compare((dynamic_string *)(p_Var9 + 1),"in",false);
        if (iVar7 == 0) {
          if (*(int *)&p_Var9[1]._M_right == 0) {
            bVar5 = false;
            console::error("Must follow /in parameter with a filename!\n");
            goto LAB_001095ce;
          }
          uVar21 = 0;
          local_380 = p_Var9;
          do {
            p_Var2 = local_380[1]._M_left;
            local_3e8.m_files.m_p = (file_desc *)0x0;
            local_3e8.m_files.m_size = 0;
            local_3e8.m_files.m_capacity = 0;
            local_3e8.m_last_error = 0;
            pcVar16 = (char *)(&p_Var2->_M_parent)[uVar21 * 2];
            local_370 = uVar21;
            pVar10 = command_line_params::get_param(&local_2e0,"deep",0);
            if ((_Base_ptr)pcVar16 == (_Base_ptr)0x0) {
              pcVar16 = "";
            }
            bVar5 = find_files::find(&local_3e8,pcVar16,
                                     (_Rb_tree_header *)pVar10._M_node !=
                                     &local_2e0.m_param_map._M_t._M_impl.super__Rb_tree_header | 4);
            pp_Var15 = &p_Var2->_M_parent + uVar21 * 2;
            if (bVar5) {
              if (local_3e8.m_files.m_size == 0) {
                pcVar16 = (char *)*pp_Var15;
                if ((_Base_ptr)pcVar16 == (_Base_ptr)0x0) {
                  pcVar16 = "";
                }
                iVar7 = 1;
                console::warning("No files found: %s",pcVar16);
              }
              else {
                local_1e0[0].m_u32 = 0xff000000;
                image<crnlib::color_quad<unsigned_char,_int>_>::image
                          (&local_a8,4,4,0xffffffff,
                           (color_quad<unsigned_char,_int> *)&local_1e0[0].field_0,0xf);
                local_1e0[0].m_u32 = 0xff000000;
                image<crnlib::color_quad<unsigned_char,_int>_>::image
                          (&local_d8,4,4,0xffffffff,
                           (color_quad<unsigned_char,_int> *)&local_1e0[0].field_0,0xf);
                local_1e0[0].m_u32 = 0xff000000;
                image<crnlib::color_quad<unsigned_char,_int>_>::image
                          (&local_108,4,4,0xffffffff,
                           (color_quad<unsigned_char,_int> *)&local_1e0[0].field_0,0xf);
                bVar5 = command_line_params::get_value_as_bool(&local_2e0,"perceptual",0,false);
                console::printf("Perceptual mode: %u",(ulong)bVar5);
                iVar7 = 0;
                if (local_3e8.m_files.m_size != 0) {
                  local_41c = (uint)!bVar5 + (uint)!bVar5 * 2;
                  uVar21 = 0;
                  do {
                    pfVar18 = local_3e8.m_files.m_p;
                    pcVar16 = local_3e8.m_files.m_p[uVar21].m_fullname.m_pStr;
                    if (pcVar16 == (char *)0x0) {
                      pcVar16 = "";
                    }
                    local_2f0 = uVar21;
                    console::printf("-------- Loading image: %s",pcVar16);
                    ppcVar17 = &pfVar18[uVar21].m_fullname.m_pStr;
                    local_3b8.m_width = 0;
                    local_3b8.m_height = 0;
                    local_3b8.m_pitch = 0;
                    local_3b8.m_total = 0;
                    local_3b8.m_comp_flags = 0xf;
                    local_3b8.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                    local_3b8.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                    local_3b8.m_pixel_buf.m_size = 0;
                    local_3b8.m_pixel_buf.m_capacity = 0;
                    pcVar16 = *ppcVar17;
                    if (pcVar16 == (char *)0x0) {
                      pcVar16 = "";
                    }
                    bVar6 = image_utils::read_from_file(&local_3b8,pcVar16,0);
                    if (bVar6) {
                      pVar10 = command_line_params::get_param(&local_2e0,"alpha",0);
                      if (((_Rb_tree_header *)pVar10._M_node ==
                           &local_2e0.m_param_map._M_t._M_impl.super__Rb_tree_header) &&
                         ((local_3b8.m_comp_flags & 8) != 0)) {
                        if (local_3b8.m_height != 0) {
                          uVar8 = 0;
                          uVar14 = local_3b8.m_width;
                          do {
                            bVar6 = uVar14 != 0;
                            uVar14 = 0;
                            if (bVar6) {
                              uVar13 = 0;
                              do {
                                local_3b8.m_pPixels[local_3b8.m_pitch * uVar8 + uVar13].field_0.
                                field_0.a = 0xff;
                                uVar13 = uVar13 + 1;
                                uVar14 = local_3b8.m_width;
                              } while (uVar13 < local_3b8.m_width);
                            }
                            uVar8 = uVar8 + 1;
                          } while (uVar8 < local_3b8.m_height);
                        }
                        local_3b8.m_comp_flags = local_3b8.m_comp_flags & 0xfffffff7;
                      }
                      mipmapped_texture::mipmapped_texture
                                ((mipmapped_texture *)&local_1e0[0].field_0);
                      piVar11 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
                                crnlib_malloc(0x30);
                      image<crnlib::color_quad<unsigned_char,_int>_>::image(piVar11,&local_3b8);
                      mipmapped_texture::assign
                                ((mipmapped_texture *)&local_1e0[0].field_0,piVar11,
                                 PIXEL_FMT_INVALID,cDefaultOrientationFlags);
                      pVar10 = command_line_params::get_param(&local_2e0,"nomips",0);
                      if ((_Rb_tree_header *)pVar10._M_node ==
                          &local_2e0.m_param_map._M_t._M_impl.super__Rb_tree_header) {
                        local_228._0_8_ = "kaiser";
                        local_228[8] = false;
                        local_228[9] = true;
                        local_228[10] = false;
                        local_228[0xb] = false;
                        local_228._12_8_ = 0x3fe000003f666666;
                        local_228[0x14] = true;
                        local_210._0_4_ = cCompFlagRValid;
                        local_210._4_4_ = PIXEL_FMT_INVALID;
                        console::printf("Generating mipmaps");
                        bVar6 = mipmapped_texture::generate_mipmaps
                                          ((mipmapped_texture *)&local_1e0[0].field_0,
                                           (generate_mipmap_params *)local_228,false);
                        if (bVar6) goto LAB_00108bd1;
                        console::error("Mipmap generation failed!");
                        iVar7 = 1;
                      }
                      else {
LAB_00108bd1:
                        console::printf("Compress 1");
                        mipmapped_texture::mipmapped_texture
                                  ((mipmapped_texture *)local_228,
                                   (mipmapped_texture *)&local_1e0[0].field_0);
                        local_350.m_quality = cCRNDXTQualityUber;
                        local_350.m_compressor = cCRNDXTCompressorCRN;
                        local_350.m_perceptual = true;
                        local_350.m_dithering = false;
                        local_350.m_grayscale_sampling = false;
                        local_350.m_use_both_block_types = true;
                        local_350.m_endpoint_caching = true;
                        local_350.m_pProgress_callback = (progress_callback_func)0x0;
                        local_350.m_pProgress_callback_user_data_ptr = (void *)0x0;
                        local_350.m_dxt1a_alpha_threshold = 0x80;
                        local_350.m_num_helper_threads = 0;
                        local_350.m_progress_start = 0;
                        local_350.m_progress_range = 100;
                        local_350.m_use_transparent_indices_for_black = false;
                        local_350.m_pTask_pool = (task_pool *)0x0;
                        local_350.m_endpoint_caching =
                             command_line_params::get_value_as_bool
                                       (&local_2e0,"endpointcaching",0,false);
                        local_350.m_quality = cCRNDXTQualityNormal;
                        local_350.m_compressor = cCRNDXTCompressorCRN;
                        local_350.m_perceptual = bVar5;
                        bVar6 = command_line_params::get_value_as_bool
                                          (&local_2e0,"multithreaded",0,true);
                        uVar14 = g_number_of_processors - 1;
                        if (!bVar6) {
                          uVar14 = 0;
                        }
                        local_350.m_num_helper_threads = uVar14;
                        local_350.m_pProgress_callback = progress_callback;
                        timer::timer(&local_2a0);
                        timer::start(&local_2a0);
                        bVar6 = mipmapped_texture::convert
                                          ((mipmapped_texture *)local_228,PIXEL_FMT_ETC1,false,
                                           &local_350);
                        if (bVar6) {
                          local_378 = timer::get_elapsed_secs(&local_2a0);
                          console::printf("Elapsed time: %3.3f",SUB84(local_378,0));
                          console::printf("Compress 2");
                          mipmapped_texture::mipmapped_texture
                                    (&local_78,(mipmapped_texture *)&local_1e0[0].field_0);
                          local_350.m_endpoint_caching = false;
                          local_350.m_quality = cCRNDXTQualitySuperFast;
                          local_350.m_compressor = cCRNDXTCompressorCRN;
                          timer::start(&local_2a0);
                          bVar6 = mipmapped_texture::convert
                                            (&local_78,PIXEL_FMT_ETC1,false,&local_350);
                          if (bVar6) {
                            local_428 = (image_u8 *)timer::get_elapsed_secs(&local_2a0);
                            console::printf("Elapsed time: %3.3f",(int)local_428);
                            local_258.m_width = 0xff000000;
                            uVar19 = 0xf;
                            image<crnlib::color_quad<unsigned_char,_int>_>::image
                                      (&local_138,local_3b8.m_width,local_3b8.m_height,0xffffffff,
                                       (color_quad<unsigned_char,_int> *)&local_258,0xf);
                            local_3f8 = local_3f8 + (double)local_428;
                            uVar21 = 0;
                            while( true ) {
                              if (local_1b8 == 0) {
                                uVar12 = 0;
                              }
                              else {
                                uVar12 = (ulong)(uint)local_1c0[1];
                              }
                              if (uVar12 <= uVar21) break;
                              local_258.m_width = 0;
                              local_258.m_height = 0;
                              local_258.m_pitch = 0;
                              local_258.m_total = 0;
                              local_258.m_comp_flags = 0xf;
                              local_258.m_pixel_buf.m_size = 0;
                              local_258.m_pixel_buf.m_capacity = 0;
                              local_258.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                              local_258.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                              local_168.m_width = 0;
                              local_168.m_height = 0;
                              local_168.m_pitch = 0;
                              local_168.m_total = 0;
                              local_168.m_comp_flags = 0xf;
                              local_168.m_pixel_buf.m_size = 0;
                              local_168.m_pixel_buf.m_capacity = 0;
                              local_168.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                              local_168.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                              local_198.m_width = 0;
                              local_198.m_height = 0;
                              local_198.m_pitch = 0;
                              local_198.m_total = 0;
                              local_198.m_comp_flags = 0xf;
                              local_198.m_pixel_buf.m_size = 0;
                              local_198.m_pixel_buf.m_capacity = 0;
                              local_198.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                              local_198.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                              local_428 = mip_level::get_unpacked_image
                                                    (*(mip_level **)(*local_1c0 + uVar21 * 8),
                                                     &local_258,3);
                              local_358 = mip_level::get_unpacked_image
                                                    (local_208->m_p[uVar21],&local_168,3);
                              local_2e8 = uVar21;
                              local_360 = mip_level::get_unpacked_image
                                                    ((local_78.m_faces.m_p)->m_p[uVar21],&local_198,
                                                     3);
                              uVar14 = (uint)uVar19;
                              local_3bc = local_428->m_width + 3;
                              uVar8 = local_428->m_height + 3;
                              local_408.m_p = (error_metrics *)0x0;
                              local_408.m_size = 0;
                              local_408.m_capacity = 0;
                              local_418.m_p = (error_metrics *)0x0;
                              local_418.m_size = 0;
                              local_418.m_capacity = 0;
                              uVar13 = local_3bc >> 2;
                              local_420 = uVar8 >> 2;
                              if (3 < uVar8) {
                                local_3c8 = 0;
                                do {
                                  if (3 < local_3bc) {
                                    y = (int)local_3c8 * 4;
                                    uVar14 = 0;
                                    uVar8 = uVar13;
                                    do {
                                      image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                                (local_428,local_a8.m_pPixels,uVar14,y,4,4,false);
                                      image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                                (local_358,local_d8.m_pPixels,uVar14,y,4,4,false);
                                      image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                                (local_360,local_108.m_pPixels,uVar14,y,4,4,false);
                                      num_channels = local_41c;
                                      local_318.mMeanSquared = 0.0;
                                      local_318.mRootMeanSquared = 0.0;
                                      local_318.mMax = 0;
                                      local_318._4_4_ = 0;
                                      local_318.mMean = 0.0;
                                      local_318.mPeakSNR = 0.0;
                                      image_utils::error_metrics::compute
                                                (&local_318,&local_a8,&local_d8,0,local_41c,true);
                                      local_288.mMeanSquared = 0.0;
                                      local_288.mRootMeanSquared = 0.0;
                                      local_288.mMax = 0;
                                      local_288._4_4_ = 0;
                                      local_288.mMean = 0.0;
                                      local_288.mPeakSNR = 0.0;
                                      uVar19 = 1;
                                      image_utils::error_metrics::compute
                                                (&local_288,&local_a8,&local_108,0,num_channels,true
                                                );
                                      if (local_418.m_capacity <= local_418.m_size) {
                                        uVar19 = 0;
                                        elemental_vector::increase_capacity
                                                  ((elemental_vector *)&local_418,
                                                   local_418.m_size + 1,true,0x28,
                                                   vector<crnlib::image_utils::error_metrics>::
                                                   object_mover,false);
                                      }
                                      local_418.m_p[local_418.m_size].mPeakSNR = local_318.mPeakSNR;
                                      local_418.m_p[local_418.m_size].mMeanSquared =
                                           local_318.mMeanSquared;
                                      (&local_418.m_p[local_418.m_size].mMeanSquared)[1] =
                                           local_318.mRootMeanSquared;
                                      peVar1 = local_418.m_p + local_418.m_size;
                                      peVar1->mMax = local_318.mMax;
                                      *(undefined4 *)&peVar1->field_0x4 = local_318._4_4_;
                                      peVar1->mMean = local_318.mMean;
                                      local_418.m_size = local_418.m_size + 1;
                                      if (local_408.m_capacity <= local_408.m_size) {
                                        uVar19 = 0;
                                        elemental_vector::increase_capacity
                                                  ((elemental_vector *)&local_408,
                                                   local_408.m_size + 1,true,0x28,
                                                   vector<crnlib::image_utils::error_metrics>::
                                                   object_mover,false);
                                      }
                                      local_408.m_p[local_408.m_size].mPeakSNR = local_288.mPeakSNR;
                                      local_408.m_p[local_408.m_size].mMeanSquared =
                                           local_288.mMeanSquared;
                                      (&local_408.m_p[local_408.m_size].mMeanSquared)[1] =
                                           local_288.mRootMeanSquared;
                                      peVar1 = local_408.m_p + local_408.m_size;
                                      peVar1->mMax = local_288.mMax;
                                      *(undefined4 *)&peVar1->field_0x4 = local_288._4_4_;
                                      peVar1->mMean = local_288.mMean;
                                      local_408.m_size = local_408.m_size + 1;
                                      piVar11 = &local_d8;
                                      if (local_318.mPeakSNR < local_288.mPeakSNR) {
                                        add_bad_block(local_368,&local_a8);
                                        piVar11 = &local_108;
                                      }
                                      image<crnlib::color_quad<unsigned_char,_int>_>::blit
                                                (&local_138,uVar14,y,piVar11);
                                      uVar14 = uVar14 + 4;
                                      uVar8 = uVar8 - 1;
                                    } while (uVar8 != 0);
                                  }
                                  uVar14 = (uint)uVar19;
                                  uVar8 = (int)local_3c8 + 1;
                                  local_3c8 = (ulong)uVar8;
                                } while (uVar8 != local_420);
                              }
                              pVar10 = command_line_params::get_param(&local_2e0,"writehybrid",0);
                              uVar21 = local_2e8;
                              if ((_Rb_tree_header *)pVar10._M_node !=
                                  &local_2e0.m_param_map._M_t._M_impl.super__Rb_tree_header) {
                                image_utils::write_to_file("hybrid.tga",&local_138,1,-1);
                              }
                              uVar8 = local_420;
                              console::printf("---- Mip level: %u, Total blocks: %ux%u, %u",
                                              uVar21 & 0xffffffff,(ulong)uVar13,(ulong)local_420,
                                              (ulong)(local_420 * uVar13));
                              pcVar16 = "Compressor 1:";
                              console::printf("Compressor 1:");
                              print_metric_stats((corpus_tester *)pcVar16,&local_418,uVar13,uVar8);
                              pcVar16 = "Compressor 2:";
                              console::printf("Compressor 2:");
                              print_metric_stats((corpus_tester *)pcVar16,&local_408,uVar13,uVar8);
                              pcVar16 = "Compressor 1 vs. 2:";
                              console::printf("Compressor 1 vs. 2:");
                              print_comparative_metric_stats
                                        ((corpus_tester *)pcVar16,&local_2e0,&local_418,&local_408,
                                         uVar13,uVar14);
                              uVar14 = local_41c;
                              local_318.mMeanSquared = 0.0;
                              local_318.mRootMeanSquared = 0.0;
                              local_318.mMax = 0;
                              local_318._4_4_ = 0;
                              local_318.mMean = 0.0;
                              local_318.mPeakSNR = 0.0;
                              image_utils::error_metrics::compute
                                        (&local_318,local_428,local_358,0,local_41c,true);
                              image_utils::error_metrics::print(&local_318,"Compressor 1: ");
                              image_utils::error_metrics::compute
                                        (&local_318,local_428,local_360,0,uVar14,true);
                              image_utils::error_metrics::print(&local_318,"Compressor 2: ");
                              uVar19 = 1;
                              image_utils::error_metrics::compute
                                        (&local_318,local_428,&local_138,0,uVar14,true);
                              image_utils::error_metrics::print(&local_318,"Best of Both: ");
                              lVar20 = 0x20;
                              do {
                                if (*(void **)((long)&local_428 + lVar20) != (void *)0x0) {
                                  crnlib_free(*(void **)((long)&local_428 + lVar20));
                                }
                                lVar20 = lVar20 + -0x10;
                              } while (lVar20 != 0);
                              if (local_198.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0
                                 ) {
                                crnlib_free(local_198.m_pixel_buf.m_p);
                              }
                              if (local_168.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0
                                 ) {
                                crnlib_free(local_168.m_pixel_buf.m_p);
                              }
                              if (local_258.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0
                                 ) {
                                crnlib_free(local_258.m_pixel_buf.m_p);
                              }
                              uVar21 = uVar21 + 1;
                            }
                            if (local_138.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0)
                            {
                              crnlib_free(local_138.m_pixel_buf.m_p);
                            }
                            iVar7 = 0;
                          }
                          else {
                            iVar7 = 1;
                            console::error("Texture conversion failed!");
                          }
                          local_3f0 = local_3f0 + local_378;
                          mipmapped_texture::~mipmapped_texture(&local_78);
                        }
                        else {
                          iVar7 = 1;
                          console::error("Texture conversion failed!");
                        }
                        mipmapped_texture::~mipmapped_texture((mipmapped_texture *)local_228);
                      }
                      mipmapped_texture::~mipmapped_texture
                                ((mipmapped_texture *)&local_1e0[0].field_0);
                    }
                    else {
                      pcVar16 = *ppcVar17;
                      if (pcVar16 == (char *)0x0) {
                        pcVar16 = "";
                      }
                      iVar7 = 10;
                      console::warning("Failed loading image file: %s",pcVar16);
                    }
                    if (local_3b8.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                      crnlib_free(local_3b8.m_pixel_buf.m_p);
                    }
                  } while (((iVar7 == 10) || (iVar7 == 0)) &&
                          (uVar21 = local_2f0 + 1, iVar7 = 0,
                          uVar21 < (local_3e8.m_files._8_8_ & 0xffffffff)));
                }
                if (local_108.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                  crnlib_free(local_108.m_pixel_buf.m_p);
                }
                if (local_d8.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                  crnlib_free(local_d8.m_pixel_buf.m_p);
                }
                if (local_a8.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                  crnlib_free(local_a8.m_pixel_buf.m_p);
                }
              }
            }
            else {
              pcVar16 = (char *)*pp_Var15;
              if ((_Base_ptr)pcVar16 == (_Base_ptr)0x0) {
                pcVar16 = "";
              }
              iVar7 = 7;
              console::warning("Failed finding files: %s",pcVar16);
            }
            uVar21 = local_370;
            if (local_3e8.m_files.m_p != (file_desc *)0x0) {
              if ((local_3e8.m_files._8_8_ & 0xffffffff) != 0) {
                lVar20 = (local_3e8.m_files._8_8_ & 0xffffffff) * 0x48;
                pfVar18 = local_3e8.m_files.m_p;
                do {
                  find_files::file_desc::~file_desc(pfVar18);
                  pfVar18 = pfVar18 + 1;
                  lVar20 = lVar20 + -0x48;
                } while (lVar20 != 0);
              }
              uVar21 = local_370;
              crnlib_free(local_3e8.m_files.m_p);
            }
            p_Var9 = local_380;
            if ((iVar7 != 0) && (iVar7 != 7)) {
              if (iVar7 != 5) goto LAB_00109595;
              break;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < *(uint *)&local_380[1]._M_right);
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 !=
               &local_2e0.m_param_map._M_t._M_impl.super__Rb_tree_header);
    }
    flush_bad_blocks(local_368);
    bVar5 = true;
    console::printf("Total times: %4.3f vs. %4.3f",SUB84(local_3f0,0),SUB84(local_3f8,0));
  }
  else {
LAB_00109595:
    bVar5 = false;
  }
LAB_001095ce:
  std::
  _Rb_tree<crnlib::dynamic_string,_std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>,_std::_Select1st<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
  ::~_Rb_tree(&local_2e0.m_param_map._M_t);
  pdVar4 = local_2e0.m_params.m_p;
  if (local_2e0.m_params.m_p != (dynamic_string *)0x0) {
    if ((ulong)local_2e0.m_params.m_size != 0) {
      lVar20 = 0;
      do {
        lVar3 = *(long *)((long)&pdVar4->m_pStr + lVar20);
        if ((lVar3 != 0) && ((*(uint *)(lVar3 + -8) ^ *(uint *)(lVar3 + -4)) == 0xffffffff)) {
          crnlib_free((void *)(lVar3 + -0x10));
        }
        lVar20 = lVar20 + 0x10;
      } while ((ulong)local_2e0.m_params.m_size << 4 != lVar20);
    }
    crnlib_free(local_2e0.m_params.m_p);
  }
  return bVar5;
}

Assistant:

bool corpus_tester::test(const char* pCmd_line) {
  console::printf("Command line:\n\"%s\"", pCmd_line);

  static const command_line_params::param_desc param_desc_array[] =
      {
          {"corpus_test", 0, false},
          {"in", 1, true},
          {"deep", 0, false},
          {"alpha", 0, false},
          {"nomips", 0, false},
          {"perceptual", 0, false},
          {"endpointcaching", 0, false},
          {"multithreaded", 0, false},
          {"writehybrid", 0, false},
          {"nobadblocks", 0, false},
      };

  command_line_params cmd_line_params;
  if (!cmd_line_params.parse(pCmd_line, CRNLIB_ARRAY_SIZE(param_desc_array), param_desc_array, true))
    return false;

  double total_time1 = 0, total_time2 = 0;

  command_line_params::param_map_const_iterator it = cmd_line_params.begin();
  for (; it != cmd_line_params.end(); ++it) {
    if (it->first != "in")
      continue;
    if (it->second.m_values.empty()) {
      console::error("Must follow /in parameter with a filename!\n");
      return false;
    }

    for (uint in_value_index = 0; in_value_index < it->second.m_values.size(); in_value_index++) {
      const dynamic_string& filespec = it->second.m_values[in_value_index];

      find_files file_finder;
      if (!file_finder.find(filespec.get_ptr(), find_files::cFlagAllowFiles | (cmd_line_params.has_key("deep") ? find_files::cFlagRecursive : 0))) {
        console::warning("Failed finding files: %s", filespec.get_ptr());
        continue;
      }

      if (file_finder.get_files().empty()) {
        console::warning("No files found: %s", filespec.get_ptr());
        return false;
      }

      const find_files::file_desc_vec& files = file_finder.get_files();

      image_u8 o(4, 4), a(4, 4), b(4, 4);

      uint first_channel = 0;
      uint num_channels = 3;
      bool perceptual = cmd_line_params.get_value_as_bool("perceptual", false);
      if (perceptual) {
        first_channel = 0;
        num_channels = 0;
      }
      console::printf("Perceptual mode: %u", perceptual);

      for (uint file_index = 0; file_index < files.size(); file_index++) {
        const find_files::file_desc& file_desc = files[file_index];

        console::printf("-------- Loading image: %s", file_desc.m_fullname.get_ptr());

        image_u8 img;
        if (!image_utils::read_from_file(img, file_desc.m_fullname.get_ptr(), 0)) {
          console::warning("Failed loading image file: %s", file_desc.m_fullname.get_ptr());
          continue;
        }

        if ((!cmd_line_params.has_key("alpha")) && img.is_component_valid(3)) {
          for (uint y = 0; y < img.get_height(); y++)
            for (uint x = 0; x < img.get_width(); x++)
              img(x, y).a = 255;

          img.set_component_valid(3, false);
        }

        mipmapped_texture orig_tex;
        orig_tex.assign(crnlib_new<image_u8>(img));

        if (!cmd_line_params.has_key("nomips")) {
          mipmapped_texture::generate_mipmap_params genmip_params;
          genmip_params.m_srgb = true;

          console::printf("Generating mipmaps");

          if (!orig_tex.generate_mipmaps(genmip_params, false)) {
            console::error("Mipmap generation failed!");
            return false;
          }
        }

        console::printf("Compress 1");

        mipmapped_texture tex1(orig_tex);
        dxt_image::pack_params convert_params;
        convert_params.m_endpoint_caching = cmd_line_params.get_value_as_bool("endpointcaching", 0, false);
        convert_params.m_compressor = cCRNDXTCompressorCRN;
        convert_params.m_quality = cCRNDXTQualityNormal;
        convert_params.m_perceptual = perceptual;
        convert_params.m_num_helper_threads = cmd_line_params.get_value_as_bool("multithreaded", 0, true) ? (g_number_of_processors - 1) : 0;
        convert_params.m_pProgress_callback = progress_callback;
        timer t;
        t.start();
        if (!tex1.convert(PIXEL_FMT_ETC1, false, convert_params)) {
          console::error("Texture conversion failed!");
          return false;
        }
        double time1 = t.get_elapsed_secs();
        total_time1 += time1;
        console::printf("Elapsed time: %3.3f", time1);

        console::printf("Compress 2");

        mipmapped_texture tex2(orig_tex);
        convert_params.m_endpoint_caching = false;
        convert_params.m_compressor = cCRNDXTCompressorCRN;
        convert_params.m_quality = cCRNDXTQualitySuperFast;
        t.start();
        if (!tex2.convert(PIXEL_FMT_ETC1, false, convert_params)) {
          console::error("Texture conversion failed!");
          return false;
        }
        double time2 = t.get_elapsed_secs();
        total_time2 += time2;
        console::printf("Elapsed time: %3.3f", time2);

        image_u8 hybrid_img(img.get_width(), img.get_height());

        for (uint l = 0; l < orig_tex.get_num_levels(); l++) {
          image_u8 orig_img, img1, img2;

          image_u8* pOrig = orig_tex.get_level(0, l)->get_unpacked_image(orig_img, cUnpackFlagUncook | cUnpackFlagUnflip);
          image_u8* pImg1 = tex1.get_level(0, l)->get_unpacked_image(img1, cUnpackFlagUncook | cUnpackFlagUnflip);
          image_u8* pImg2 = tex2.get_level(0, l)->get_unpacked_image(img2, cUnpackFlagUncook | cUnpackFlagUnflip);

          const uint num_blocks_x = pOrig->get_block_width(4);
          const uint num_blocks_y = pOrig->get_block_height(4);

          crnlib::vector<image_utils::error_metrics> metrics[2];

          for (uint by = 0; by < num_blocks_y; by++) {
            for (uint bx = 0; bx < num_blocks_x; bx++) {
              pOrig->extract_block(o.get_ptr(), bx * 4, by * 4, 4, 4);
              pImg1->extract_block(a.get_ptr(), bx * 4, by * 4, 4, 4);
              pImg2->extract_block(b.get_ptr(), bx * 4, by * 4, 4, 4);

              image_utils::error_metrics em1;
              em1.compute(o, a, first_channel, num_channels);

              image_utils::error_metrics em2;
              em2.compute(o, b, first_channel, num_channels);

              metrics[0].push_back(em1);
              metrics[1].push_back(em2);

              if (em1.mPeakSNR < em2.mPeakSNR) {
                add_bad_block(o);

                hybrid_img.blit(bx * 4, by * 4, b);
              } else {
                hybrid_img.blit(bx * 4, by * 4, a);
              }
            }
          }

          if (cmd_line_params.has_key("writehybrid"))
            image_utils::write_to_file("hybrid.tga", hybrid_img, image_utils::cWriteFlagIgnoreAlpha);

          console::printf("---- Mip level: %u, Total blocks: %ux%u, %u", l, num_blocks_x, num_blocks_y, num_blocks_x * num_blocks_y);

          console::printf("Compressor 1:");
          print_metric_stats(metrics[0], num_blocks_x, num_blocks_y);

          console::printf("Compressor 2:");
          print_metric_stats(metrics[1], num_blocks_x, num_blocks_y);

          console::printf("Compressor 1 vs. 2:");
          print_comparative_metric_stats(cmd_line_params, metrics[0], metrics[1], num_blocks_x, num_blocks_y);

          image_utils::error_metrics em;

          em.compute(*pOrig, *pImg1, 0, perceptual ? 0 : 3);
          em.print("Compressor 1: ");

          em.compute(*pOrig, *pImg2, 0, perceptual ? 0 : 3);
          em.print("Compressor 2: ");

          em.compute(*pOrig, hybrid_img, 0, perceptual ? 0 : 3);
          em.print("Best of Both: ");
        }
      }

    }  // file_index
  }

  flush_bad_blocks();

  console::printf("Total times: %4.3f vs. %4.3f", total_time1, total_time2);

  return true;
}